

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGhsMultiGenerator::WriteSubProjects
          (cmGlobalGhsMultiGenerator *this,ostream *fout,bool filterPredefined)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer ppcVar3;
  cmGeneratorTarget *this_00;
  pointer pcVar4;
  int iVar5;
  TargetType TVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string *psVar7;
  iterator iVar8;
  long *plVar9;
  ostream *poVar10;
  size_type *psVar11;
  undefined7 in_register_00000011;
  pointer ppcVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  predefinedTargets;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined4 local_8c;
  long *local_88 [2];
  long local_78 [2];
  ostream *local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_8c = (undefined4)CONCAT71(in_register_00000011,filterPredefined);
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68 = fout;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  iVar5 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x1a])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,(char *)CONCAT44(extraout_var,iVar5),(allocator<char> *)local_88);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_60,&local_b0);
  paVar2 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  iVar5 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x19])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,(char *)CONCAT44(extraout_var_00,iVar5),(allocator<char> *)local_88
            );
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_60,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,CHECK_BUILD_SYSTEM_TARGET,(allocator<char> *)local_88);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_60,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  ppcVar12 = (this->ProjectTargets).
             super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppcVar3 = (this->ProjectTargets).
            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppcVar12 == ppcVar3) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_60);
      return;
    }
    this_00 = *ppcVar12;
    TVar6 = cmGeneratorTarget::GetType(this_00);
    if (TVar6 != INTERFACE_LIBRARY) {
      TVar6 = cmGeneratorTarget::GetType(this_00);
      if (TVar6 != MODULE_LIBRARY) {
        TVar6 = cmGeneratorTarget::GetType(this_00);
        if (TVar6 != SHARED_LIBRARY) {
          TVar6 = cmGeneratorTarget::GetType(this_00);
          if (TVar6 == GLOBAL_TARGET) {
            psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
            (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x1a])(this);
            iVar5 = std::__cxx11::string::compare((char *)psVar7);
            if (iVar5 != 0) goto LAB_0032e4e1;
          }
          psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
          iVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find(&local_60,psVar7);
          if (((_Rb_tree_header *)iVar8._M_node != p_Var1) == (bool)(char)local_8c) {
            psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
            local_88[0] = local_78;
            pcVar4 = (psVar7->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_88,pcVar4,pcVar4 + psVar7->_M_string_length);
            std::__cxx11::string::append((char *)local_88);
            plVar9 = (long *)std::__cxx11::string::append((char *)local_88);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            psVar11 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_b0.field_2._M_allocated_capacity = *psVar11;
              local_b0.field_2._8_8_ = plVar9[3];
            }
            else {
              local_b0.field_2._M_allocated_capacity = *psVar11;
              local_b0._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_b0._M_string_length = plVar9[1];
            *plVar9 = (long)psVar11;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (local_68,local_b0._M_dataplus._M_p,local_b0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," [Project]\n",0xb);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if (local_88[0] != local_78) {
              operator_delete(local_88[0],local_78[0] + 1);
            }
          }
        }
      }
    }
LAB_0032e4e1:
    ppcVar12 = ppcVar12 + 1;
  } while( true );
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteSubProjects(std::ostream& fout,
                                                 bool filterPredefined)
{
  std::set<std::string> predefinedTargets;
  predefinedTargets.insert(this->GetInstallTargetName());
  predefinedTargets.insert(this->GetAllTargetName());
  predefinedTargets.insert(std::string(CHECK_BUILD_SYSTEM_TARGET));

  // All known targets
  for (cmGeneratorTarget const* target : this->ProjectTargets) {
    if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        (target->GetType() == cmStateEnums::GLOBAL_TARGET &&
         target->GetName() != this->GetInstallTargetName())) {
      continue;
    }
    /* Check if the current target is a predefined CMake target */
    bool predefinedTarget =
      predefinedTargets.find(target->GetName()) != predefinedTargets.end();
    if ((filterPredefined && predefinedTarget) ||
        (!filterPredefined && !predefinedTarget)) {
      fout << target->GetName() + ".tgt" + FILE_EXTENSION << " [Project]\n";
    }
  }
}